

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subsystem_netconf.c
# Opt level: O0

ssize_t netconf_read_until(LIBSSH2_CHANNEL *channel,char *endtag,char *buf,size_t buflen)

{
  ulong uVar1;
  char *__haystack;
  bool local_51;
  char *local_50;
  char *specialsequence;
  char *endreply;
  size_t rd;
  ssize_t len;
  size_t buflen_local;
  char *buf_local;
  char *endtag_local;
  LIBSSH2_CHANNEL *channel_local;
  
  endreply = (char *)0x0;
  local_50 = (char *)0x0;
  memset(buf,0,buflen);
  do {
    uVar1 = libssh2_channel_read_ex(channel,0,buf + (long)endreply,buflen - (long)endreply);
    if (uVar1 != 0xffffffffffffffdb) {
      if ((long)uVar1 < 0) {
        fprintf(_stderr,"libssh2_channel_read: %d\n",uVar1 & 0xffffffff);
        return -1;
      }
      endreply = endreply + uVar1;
      __haystack = strstr(buf,endtag);
      if (__haystack != (char *)0x0) {
        local_50 = strstr(__haystack,"]]>]]>");
      }
    }
    local_51 = local_50 == (char *)0x0 && endreply < buflen;
  } while (local_51);
  if (local_50 == (char *)0x0) {
    fprintf(_stderr,"netconf_read_until(): ]]>]]> not found! read buffer too small?\n");
    channel_local = (LIBSSH2_CHANNEL *)0xffffffffffffffff;
  }
  else {
    channel_local = (LIBSSH2_CHANNEL *)(local_50 + -(long)buf);
    buf[(long)channel_local] = '\0';
  }
  return (ssize_t)channel_local;
}

Assistant:

static ssize_t netconf_read_until(LIBSSH2_CHANNEL *channel, const char *endtag,
                                  char *buf, size_t buflen)
{
    ssize_t len;
    size_t rd = 0;
    char *endreply = NULL, *specialsequence = NULL;

    memset(buf, 0, buflen);

    do {
        len = libssh2_channel_read(channel, buf + rd, buflen - rd);
        if(LIBSSH2_ERROR_EAGAIN == len)
            continue;
        else if(len < 0) {
            fprintf(stderr, "libssh2_channel_read: %d\n", (int)len);
            return -1;
        }
        rd += len;

        /* read more data until we see a rpc-reply closing tag followed by
         * the special sequence ]]>]]> */

        /* really, this MUST be replaced with proper XML parsing! */

        endreply = strstr(buf, endtag);
        if(endreply)
            specialsequence = strstr(endreply, "]]>]]>");

    } while(!specialsequence && rd < buflen);

    if(!specialsequence) {
        fprintf(stderr, "netconf_read_until(): ]]>]]> not found!"
                        " read buffer too small?\n");
        return -1;
    }

    /* discard the special sequence so that only XML is returned */
    rd = specialsequence - buf;
    buf[rd] = 0;

    return rd;
}